

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O3

void __thiscall miniros::IntraProcessSubscriberLink::drop(IntraProcessSubscriberLink *this)

{
  recursive_mutex *__mutex;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Publication *this_00;
  int iVar3;
  _Atomic_word _Var4;
  bool bVar5;
  string local_40;
  
  __mutex = &this->drop_mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->dropped_ != true) {
    this->dropped_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    peVar1 = (this->subscriber_).
             super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      (*(peVar1->super_PublisherLink)._vptr_PublisherLink[5])();
      p_Var2 = (this->subscriber_).
               super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->subscriber_).
      super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->subscriber_).
      super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    p_Var2 = (this->super_SubscriberLink).parent_.
             super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var4 = p_Var2->_M_use_count;
      do {
        if (_Var4 == 0) {
          return;
        }
        LOCK();
        iVar3 = p_Var2->_M_use_count;
        bVar5 = _Var4 == iVar3;
        if (bVar5) {
          p_Var2->_M_use_count = _Var4 + 1;
          iVar3 = _Var4;
        }
        _Var4 = iVar3;
        UNLOCK();
      } while (!bVar5);
      this_00 = (this->super_SubscriberLink).parent_.
                super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 != (Publication *)0x0 && p_Var2->_M_use_count != 0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (drop::loc.initialized_ == false) {
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"miniros.intraprocess_subscriber_link","");
          console::initializeLogLocation(&drop::loc,&local_40,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
        }
        if (drop::loc.level_ != Debug) {
          console::setLogLocationLevel(&drop::loc,Debug);
          console::checkLogLocationEnabled(&drop::loc);
        }
        if (drop::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,drop::loc.logger_,drop::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/intraprocess_subscriber_link.cpp"
                         ,0x73,"virtual void miniros::IntraProcessSubscriberLink::drop()",
                         "Connection to local subscriber on topic [%s] dropped",
                         (this->super_SubscriberLink).topic_._M_dataplus._M_p);
        }
        std::__shared_ptr<miniros::SubscriberLink,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<miniros::SubscriberLink,void>
                  ((__shared_ptr<miniros::SubscriberLink,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                   (__weak_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2> *)
                   &(this->super_SubscriberLink).
                    super_enable_shared_from_this<miniros::SubscriberLink>);
        Publication::removeSubscriberLink(this_00,(SubscriberLinkPtr *)&local_40);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length);
        }
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void IntraProcessSubscriberLink::drop()
{
  {
    std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  if (subscriber_)
  {
    subscriber_->drop();
    subscriber_.reset();
  }

  if (PublicationPtr parent = parent_.lock())
  {
    MINIROS_DEBUG("Connection to local subscriber on topic [%s] dropped", topic_.c_str());

    parent->removeSubscriberLink(shared_from_this());
  }
}